

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

float Jf_CutCompareArea(Jf_Cut_t *pOld,Jf_Cut_t *pNew)

{
  int iVar1;
  
  if (pOld->Flow < pNew->Flow + -0.005) {
    return -1.0;
  }
  if (pOld->Flow <= pNew->Flow + 0.005) {
    iVar1 = pOld->pCut[0] - pNew->pCut[0];
    if ((iVar1 == 0) && (iVar1 = pOld->Time - pNew->Time, iVar1 == 0)) {
      return 0.0;
    }
    return (float)iVar1;
  }
  return 1.0;
}

Assistant:

float Jf_CutCompareArea( Jf_Cut_t * pOld, Jf_Cut_t * pNew )
{
//    if ( pOld->Flow    != pNew->Flow    ) return pOld->Flow    - pNew->Flow;
    if ( pOld->Flow < pNew->Flow - JF_EPSILON ) return -1;
    if ( pOld->Flow > pNew->Flow + JF_EPSILON ) return 1;
    if ( pOld->pCut[0] != pNew->pCut[0] ) return pOld->pCut[0] - pNew->pCut[0];
    if ( pOld->Time    != pNew->Time    ) return pOld->Time    - pNew->Time;
    return 0;
}